

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::throwErrorIfNotReadableValue(Expression *e)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  CompileMessage local_f0;
  CompileMessage local_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if (e->kind == value) {
    iVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])(e);
    if ((char)iVar2 != '\0') {
      return;
    }
  }
  lVar3 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::OutputEndpointRef::typeinfo,0);
  if (lVar3 != 0) {
    CompileMessageHelpers::createMessage<>(&local_48,syntax,error,"Cannot read from an output");
    AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_48,false);
  }
  plVar4 = (long *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::InputEndpointRef::typeinfo,0);
  if (plVar4 != (long *)0x0) {
    cVar1 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (cVar1 != '\0') {
      if (*(int **)(plVar4[6] + 0x38) == (int *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      if (**(int **)(plVar4[6] + 0x38) == 3) {
        CompileMessageHelpers::createMessage<>
                  (&local_80,syntax,error,
                   "Event inputs must be handled in event callback functions, they cannot be read as expressions"
                  );
        AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_80,false);
      }
    }
  }
  lVar3 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ProcessorRef::typeinfo,0);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ProcessorInstanceRef::typeinfo,0);
    if (lVar3 == 0) {
      CompileMessageHelpers::createMessage<>(&local_f0,syntax,error,"Expected a value");
      AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_f0,false);
    }
  }
  CompileMessageHelpers::createMessage<>
            (&local_b8,syntax,error,"Cannot use a processor name as a value");
  AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_b8,false);
}

Assistant:

static void throwErrorIfNotReadableValue (AST::Expression& e)
    {
        if (! AST::isResolvedAsValue (e))
        {
            if (is_type<AST::OutputEndpointRef> (e))
                e.context.throwError (Errors::cannotReadFromOutput());

            if (auto input = cast<AST::InputEndpointRef> (e))
                if (input->isResolved())
                    if (isEvent (input->input->getDetails()))
                        e.context.throwError (Errors::cannotReadFromEventInput());

            if (is_type<AST::ProcessorRef> (e) || is_type<AST::ProcessorInstanceRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsValue());

            e.context.throwError (Errors::expectedValue());
        }
    }